

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

bool __thiscall QIconModeViewBase::filterDropEvent(QIconModeViewBase *this,QDropEvent *e)

{
  ulong uVar1;
  QSize QVar2;
  QAbstractItemModel *pQVar3;
  QPoint QVar4;
  QWidget *this_00;
  QWidgetData *pQVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  LayoutDirection LVar10;
  QListView *pQVar11;
  QListViewPrivate *pQVar12;
  Representation RVar13;
  ulong uVar14;
  int iVar15;
  Representation RVar16;
  Representation RVar17;
  Representation RVar18;
  QModelIndex *index_1;
  QModelIndex *pQVar19;
  long lVar20;
  QModelIndex *index;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Representation RVar23;
  Representation RVar24;
  QRect local_78;
  QArrayData *local_68;
  QModelIndex *pQStack_60;
  undefined1 *local_58;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = (QListView *)QDropEvent::source();
  if (pQVar11 == (this->super_QCommonListViewBase).qq) {
    QVar2 = (this->super_QCommonListViewBase).contentsSize;
    iVar7 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xd])(this);
    iVar8 = (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[0xe])(this);
    auVar21._0_8_ =
         (double)((ulong)*(double *)(e + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(e + 0x10);
    auVar21._8_8_ =
         (double)((ulong)*(double *)(e + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
         *(double *)(e + 0x18);
    auVar22 = maxpd(auVar21,_DAT_006605e0);
    RVar23.m_i = iVar7 + (int)(double)(~-(ulong)(2147483647.0 < auVar21._0_8_) & auVar22._0_8_ |
                                      -(ulong)(2147483647.0 < auVar21._0_8_) & 0x41dfffffffc00000);
    RVar24.m_i = iVar8 + (int)(double)(~-(ulong)(2147483647.0 < auVar21._8_8_) & auVar22._8_8_ |
                                      -(ulong)(2147483647.0 < auVar21._8_8_) & 0x41dfffffffc00000);
    bVar6 = QWidget::acceptDrops((QWidget *)(this->super_QCommonListViewBase).qq);
    if (bVar6) {
      local_48._4_4_ = RVar24.m_i;
      local_48._0_4_ = RVar23.m_i;
      local_48._8_4_ = RVar23.m_i;
      RStack_3c.m_i = RVar24.m_i;
      (*(this->super_QCommonListViewBase)._vptr_QCommonListViewBase[7])(&local_68,this);
      if (local_58 != (undefined1 *)0x0) {
        lVar20 = (long)local_58 * 0x18;
        pQVar19 = pQStack_60;
        do {
          pQVar3 = (pQVar19->m).ptr;
          if (pQVar3 != (QAbstractItemModel *)0x0) {
            uVar9 = (**(code **)(*(long *)pQVar3 + 0x138))(pQVar3,pQVar19);
            if ((~uVar9 & 0x28) == 0) {
              if (local_68 != (QArrayData *)0x0) {
                LOCK();
                (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_68,0x18,0x10);
                }
              }
              goto LAB_00572538;
            }
          }
          pQVar19 = pQVar19 + 1;
          lVar20 = lVar20 + -0x18;
        } while (lVar20 != 0);
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,0x18,0x10);
        }
      }
    }
    pQVar12 = (this->super_QCommonListViewBase).dd;
    QVar4 = (pQVar12->super_QAbstractItemViewPrivate).pressedPosition;
    RVar16 = QVar4.xp.m_i;
    RVar13 = QVar4.yp.m_i;
    if (pQVar12->movement == Snap) {
      RVar17 = (pQVar12->grid).wd;
      RVar18 = (pQVar12->grid).ht;
      iVar7 = (RVar23.m_i - (RVar23.m_i % RVar17.m_i + RVar16.m_i)) +
              (int)((long)((ulong)(uint)(RVar16.m_i >> 0x1f) << 0x20 | (ulong)QVar4 & 0xffffffff) %
                   (long)RVar17.m_i);
      uVar9 = (RVar24.m_i - (RVar24.m_i % RVar18.m_i + RVar13.m_i)) +
              (int)((long)((ulong)(uint)(RVar13.m_i >> 0x1f) << 0x20 | (ulong)QVar4 >> 0x20) %
                   (long)RVar18.m_i);
    }
    else {
      iVar7 = RVar23.m_i - RVar16.m_i;
      uVar9 = RVar24.m_i - RVar13.m_i;
    }
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pQStack_60 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelectionModel::selectedIndexes();
    if (local_58 != (undefined1 *)0x0) {
      lVar20 = (long)local_58 * 0x18;
      pQVar19 = pQStack_60;
      do {
        stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        _local_48 = QListViewPrivate::rectForIndex((this->super_QCommonListViewBase).dd,pQVar19);
        pQVar12 = (this->super_QCommonListViewBase).dd;
        this_00 = (pQVar12->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport;
        local_78 = QListViewPrivate::mapToViewport(pQVar12,(QRect *)local_48,false);
        QWidget::update(this_00,&local_78);
        uVar1 = local_48._0_8_ + CONCAT44(uVar9,iVar7);
        uVar14 = uVar1 & 0xffffffff | local_48._0_8_ + ((ulong)uVar9 << 0x20) & 0xffffffff00000000;
        local_78.x1.m_i = (int)uVar14;
        local_78.y1.m_i = (int)(uVar14 >> 0x20);
        LVar10 = QWidget::layoutDirection((QWidget *)(this->super_QCommonListViewBase).qq);
        if (LVar10 == RightToLeft) {
          pQVar12 = (this->super_QCommonListViewBase).dd;
          pQVar5 = ((pQVar12->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar15 = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
          iVar8 = (pQVar12->commonListView->contentsSize).wd.m_i;
          if (iVar15 <= iVar8) {
            iVar15 = iVar8;
          }
          local_78.x1.m_i = (~local_48._8_4_ - (int)uVar1) + local_48._0_4_ + iVar15;
        }
        moveItem(this,pQVar19->r,(QPoint *)&local_78);
        QAbstractItemView::update((QAbstractItemView *)(this->super_QCommonListViewBase).qq,pQVar19)
        ;
        pQVar19 = pQVar19 + 1;
        lVar20 = lVar20 + -0x18;
      } while (lVar20 != 0);
    }
    pQVar12 = (this->super_QCommonListViewBase).dd;
    QBasicTimer::stop();
    (pQVar12->super_QAbstractItemViewPrivate).autoScrollCount = 0;
    QList<QModelIndex>::clear(&this->draggedItems);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = &local_68;
    _local_48 = (QRect)(auVar22 << 0x40);
    QMetaObject::activate
              (*(QObject **)
                &(((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8
               ,&QListView::staticMetaObject,0,(void **)local_48);
    pQVar12 = (this->super_QCommonListViewBase).dd;
    (pQVar12->super_QAbstractItemViewPrivate).dropEventMoved = true;
    e[0xc] = (QDropEvent)0x1;
    iVar7 = (this->super_QCommonListViewBase).contentsSize.wd.m_i;
    iVar8 = (this->super_QCommonListViewBase).contentsSize.ht.m_i;
    RVar17 = QVar2.wd.m_i;
    RVar18 = QVar2.ht.m_i;
    if (iVar8 != RVar18.m_i || iVar7 != RVar17.m_i) {
      if (iVar7 <= RVar17.m_i || iVar8 <= RVar18.m_i) {
        updateContentsSize(this);
        pQVar12 = (this->super_QCommonListViewBase).dd;
      }
      (**(code **)(**(long **)&(pQVar12->super_QAbstractItemViewPrivate).
                               super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8 + 0x268))();
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,0x18,0x10);
      }
    }
    bVar6 = true;
  }
  else {
LAB_00572538:
    bVar6 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QIconModeViewBase::filterDropEvent(QDropEvent *e)
{
    if (e->source() != qq)
        return false;

    const QSize contents = contentsSize;
    QPoint offset(horizontalOffset(), verticalOffset());
    QPoint end = e->position().toPoint() + offset;
    if (qq->acceptDrops()) {
        const Qt::ItemFlags dropableFlags = Qt::ItemIsDropEnabled|Qt::ItemIsEnabled;
        const QList<QModelIndex> &dropIndices = intersectingSet(QRect(end, QSize(1, 1)));
        for (const QModelIndex &index : dropIndices)
            if ((index.flags() & dropableFlags) == dropableFlags)
                return false;
    }
    QPoint start = dd->pressedPosition;
    QPoint delta = (dd->movement == QListView::Snap ? snapToGrid(end) - snapToGrid(start) : end - start);
    const QList<QModelIndex> indexes = dd->selectionModel->selectedIndexes();
    for (const auto &index : indexes) {
        QRect rect = dd->rectForIndex(index);
        viewport()->update(dd->mapToViewport(rect, false));
        QPoint dest = rect.topLeft() + delta;
        if (qq->isRightToLeft())
            dest.setX(dd->flipX(dest.x()) - rect.width());
        moveItem(index.row(), dest);
        qq->update(index);
    }
    dd->stopAutoScroll();
    draggedItems.clear();
    dd->emitIndexesMoved(indexes);
    // do not delete item on internal move, see filterStartDrag()
    dd->dropEventMoved = true;
    e->accept(); // we have handled the event
    // if the size has not grown, we need to check if it has shrunk
    if (contentsSize != contents) {
        if ((contentsSize.width() <= contents.width()
            || contentsSize.height() <= contents.height())) {
                updateContentsSize();
        }
        dd->viewUpdateGeometries();
    }
    return true;
}